

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

void __thiscall CProfileNode::Call(CProfileNode *this)

{
  int iVar1;
  long in_RDI;
  
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  iVar1 = *(int *)(in_RDI + 0x18);
  *(int *)(in_RDI + 0x18) = iVar1 + 1;
  if (iVar1 == 0) {
    Profile_Get_Ticks((unsigned_long *)0x15684a);
  }
  return;
}

Assistant:

void	CProfileNode::Call( void )
{
	TotalCalls++;
	if (RecursionCounter++ == 0) {
		Profile_Get_Ticks(&StartTime);
	}
}